

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolveTriangular.h
# Opt level: O3

void Eigen::internal::
     triangular_solver_selector<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_2,_0,_-1>
     ::run(Matrix<double,__1,__1,_0,__1,__1> *lhs,Matrix<double,_3,_3,_0,_3,_3> *rhs)

{
  long size;
  BlockingType blocking;
  Index n;
  
  size = (lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  blocking.super_level3_blocking<double,_double>.m_blockA = (LhsScalar *)0x0;
  blocking.super_level3_blocking<double,_double>.m_blockB = (RhsScalar *)0x0;
  blocking.super_level3_blocking<double,_double>.m_mc = 3;
  blocking.super_level3_blocking<double,_double>.m_nc = 3;
  n = 3;
  blocking.super_level3_blocking<double,_double>.m_kc = size;
  evaluateProductBlockingSizesHeuristic<double,double,4,long>
            (&blocking.super_level3_blocking<double,_double>.m_kc,
             &blocking.super_level3_blocking<double,_double>.m_mc,&n,1);
  blocking.m_sizeA =
       blocking.super_level3_blocking<double,_double>.m_mc *
       blocking.super_level3_blocking<double,_double>.m_kc;
  blocking.m_sizeB =
       blocking.super_level3_blocking<double,_double>.m_kc *
       blocking.super_level3_blocking<double,_double>.m_nc;
  triangular_solve_matrix<double,_long,_1,_2,_false,_0,_0,_1>::run
            (size,3,(lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                    m_storage.m_data,
             (lhs->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_rows,(double *)rhs,1,3,&blocking.super_level3_blocking<double,_double>);
  free(blocking.super_level3_blocking<double,_double>.m_blockA);
  free(blocking.super_level3_blocking<double,_double>.m_blockB);
  return;
}

Assistant:

static EIGEN_DEVICE_FUNC void run(const Lhs& lhs, Rhs& rhs)
  {
    typename internal::add_const_on_value_type<ActualLhsType>::type actualLhs = LhsProductTraits::extract(lhs);

    const Index size = lhs.rows();
    const Index othersize = Side==OnTheLeft? rhs.cols() : rhs.rows();

    typedef internal::gemm_blocking_space<(Rhs::Flags&RowMajorBit) ? RowMajor : ColMajor,Scalar,Scalar,
              Rhs::MaxRowsAtCompileTime, Rhs::MaxColsAtCompileTime, Lhs::MaxRowsAtCompileTime,4> BlockingType;

    BlockingType blocking(rhs.rows(), rhs.cols(), size, 1, false);

    triangular_solve_matrix<Scalar,Index,Side,Mode,LhsProductTraits::NeedToConjugate,(int(Lhs::Flags) & RowMajorBit) ? RowMajor : ColMajor,
                               (Rhs::Flags&RowMajorBit) ? RowMajor : ColMajor, Rhs::InnerStrideAtCompileTime>
      ::run(size, othersize, &actualLhs.coeffRef(0,0), actualLhs.outerStride(), &rhs.coeffRef(0,0), rhs.innerStride(), rhs.outerStride(), blocking);
  }